

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ixgbe.cpp
# Opt level: O0

void __thiscall ixy::IxgbeDevice::reset_stats(IxgbeDevice *this)

{
  IxgbeDevice *this_local;
  
  get_reg32(this,0x4074);
  get_reg32(this,0x4080);
  get_reg32(this,0x4088);
  get_reg32(this,0x408c);
  get_reg32(this,0x4090);
  get_reg32(this,0x4094);
  return;
}

Assistant:

void IxgbeDevice::reset_stats() {
    get_reg32(IXGBE_GPRC);
    get_reg32(IXGBE_GPTC);
    get_reg32(IXGBE_GORCL);
    get_reg32(IXGBE_GORCH);
    get_reg32(IXGBE_GOTCL);
    get_reg32(IXGBE_GOTCH);
}